

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# use_move_semantics.cpp
# Opt level: O2

void __thiscall L18_1::Useless::showData(Useless *this)

{
  int i;
  
  std::operator<<((ostream *)&std::cout,"Address: ");
}

Assistant:

void Useless::showData() const {
        cout << "Address: " << (void *) pc << " ; ";
        if (n == 0) {
            cout << "(instance empty)";
        } else {
            for(int i = 0; i < n; i++) {
                cout << pc[i];
            }
        }
        cout << endl;
    }